

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_sse.c
# Opt level: O3

void itrans_dst7_pb8_sse(s16 *coeff,s16 *block,int shift,int line,int limit_line,int max_tr_val,
                        int min_tr_val,s8 *iT)

{
  bool bVar1;
  s8 *psVar2;
  int iVar3;
  int iVar4;
  s8 *psVar5;
  bool bVar6;
  bool bVar7;
  ushort *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  
  iVar4 = 1 << ((char)shift - 1U & 0x1f);
  if (0 < line) {
    iVar3 = 0;
    auVar9 = ZEXT416((uint)shift);
    do {
      psVar2 = iT;
      bVar1 = true;
      do {
        bVar7 = bVar1;
        auVar10 = (undefined1  [16])0x0;
        psVar5 = psVar2;
        puVar8 = (ushort *)coeff;
        bVar1 = true;
        do {
          bVar6 = bVar1;
          auVar12 = pshuflw(ZEXT216(*puVar8),ZEXT216(*puVar8),0);
          auVar11._0_4_ = auVar12._0_4_;
          auVar11._4_4_ = auVar11._0_4_;
          auVar11._8_4_ = auVar11._0_4_;
          auVar11._12_4_ = auVar11._0_4_;
          auVar12 = pshuflw(ZEXT216(puVar8[(uint)line]),ZEXT216(puVar8[(uint)line]),0);
          auVar12._4_4_ = auVar12._0_4_;
          auVar12._8_4_ = auVar12._0_4_;
          auVar12._12_4_ = auVar12._0_4_;
          auVar13 = pshuflw(ZEXT216(puVar8[(uint)(line * 2)]),ZEXT216(puVar8[(uint)(line * 2)]),0);
          auVar13._4_4_ = auVar13._0_4_;
          auVar13._8_4_ = auVar13._0_4_;
          auVar13._12_4_ = auVar13._0_4_;
          auVar14 = pshuflw(ZEXT216(puVar8[(uint)(line * 3)]),ZEXT216(puVar8[(uint)(line * 3)]),0);
          auVar14._4_4_ = auVar14._0_4_;
          auVar14._8_4_ = auVar14._0_4_;
          auVar14._12_4_ = auVar14._0_4_;
          auVar15 = pmovsxbw(in_XMM7,*(undefined8 *)psVar5);
          in_XMM8 = pmovsxbw(in_XMM8,*(undefined8 *)(psVar5 + 8));
          in_XMM9 = pmovsxbw(in_XMM9,*(undefined8 *)(psVar5 + 0x10));
          in_XMM10 = pmovsxbw(in_XMM10,*(undefined8 *)(psVar5 + 0x18));
          auVar15 = pmovzxwd(auVar15,auVar15);
          auVar15 = pmaddwd(auVar15,auVar11);
          in_XMM7._0_4_ = auVar15._0_4_ + auVar10._0_4_;
          in_XMM7._4_4_ = auVar15._4_4_ + auVar10._4_4_;
          in_XMM7._8_4_ = auVar15._8_4_ + auVar10._8_4_;
          in_XMM7._12_4_ = auVar15._12_4_ + auVar10._12_4_;
          auVar10 = pmovzxwd(auVar10,in_XMM8);
          auVar12 = pmaddwd(auVar10,auVar12);
          auVar10 = pmovzxwd(auVar11,in_XMM9);
          auVar13 = pmaddwd(auVar10,auVar13);
          auVar10 = pmovzxwd(auVar12,in_XMM10);
          auVar11 = pmaddwd(auVar10,auVar14);
          auVar10._0_4_ = auVar11._0_4_ + auVar13._0_4_ + auVar12._0_4_ + in_XMM7._0_4_;
          auVar10._4_4_ = auVar11._4_4_ + auVar13._4_4_ + auVar12._4_4_ + in_XMM7._4_4_;
          auVar10._8_4_ = auVar11._8_4_ + auVar13._8_4_ + auVar12._8_4_ + in_XMM7._8_4_;
          auVar10._12_4_ = auVar11._12_4_ + auVar13._12_4_ + auVar12._12_4_ + in_XMM7._12_4_;
          psVar5 = psVar5 + 0x20;
          puVar8 = puVar8 + (uint)(line * 4);
          bVar1 = false;
        } while (bVar6);
        auVar15._0_4_ = auVar10._0_4_ + iVar4 >> auVar9;
        auVar15._4_4_ = auVar10._4_4_ + iVar4 >> auVar9;
        auVar15._8_4_ = auVar10._8_4_ + iVar4 >> auVar9;
        auVar15._12_4_ = auVar10._12_4_ + iVar4 >> auVar9;
        auVar10 = packssdw(auVar15,auVar15);
        *(long *)block = auVar10._0_8_;
        coeff = (s16 *)((ushort *)coeff + ((ulong)(uint)(line * 4) * 2 - (ulong)(uint)(line * 8)));
        psVar2 = psVar2 + 4;
        block = block + 4;
        bVar1 = false;
      } while (bVar7);
      coeff = (s16 *)((ushort *)coeff + 1);
      iVar3 = iVar3 + 1;
    } while (iVar3 != line);
  }
  return;
}

Assistant:

void itrans_dst7_pb8_sse(s16 *coeff, s16 *block, int shift, int line, int limit_line, int max_tr_val, int min_tr_val, s8 *iT)
{
    int i, j, k;
    __m128i s0, s1, s2, s3;
    __m128i c0, c1, c2, c3;
    __m128i e0, e1, e2;
    __m128i r0, r1;
    __m128i zero = _mm_setzero_si128();
    __m128i rnd_factor = _mm_set1_epi32(1 << (shift - 1));
    for (i = 0; i < line; i++)
    {
        s8 *pb8 = iT;
        for (j = 0; j < 2; j++)
        {
            __m128i v0 = zero;
            for (k = 0; k < 2; k++)
            {
                //load src
                s0 = _mm_set1_epi16(coeff[0]);
                s1 = _mm_set1_epi16(coeff[line]);
                s2 = _mm_set1_epi16(coeff[2 * line]);
                s3 = _mm_set1_epi16(coeff[3 * line]);

                c0 = _mm_loadl_epi64((__m128i*)pb8);
                c0 = _mm_cvtepi8_epi16(c0);
                c1 = _mm_loadl_epi64((__m128i*)(pb8 + 8));
                c1 = _mm_cvtepi8_epi16(c1);
                c2 = _mm_loadl_epi64((__m128i*)(pb8 + 16));
                c2 = _mm_cvtepi8_epi16(c2);
                c3 = _mm_loadl_epi64((__m128i*)(pb8 + 24));
                c3 = _mm_cvtepi8_epi16(c3);
                c0 = _mm_unpacklo_epi16(c0, zero);
                c1 = _mm_unpacklo_epi16(c1, zero);
                c2 = _mm_unpacklo_epi16(c2, zero);
                c3 = _mm_unpacklo_epi16(c3, zero);

                e0 = _mm_add_epi32(_mm_madd_epi16(s0, c0), _mm_madd_epi16(s1, c1));
                e1 = _mm_add_epi32(_mm_madd_epi16(s2, c2), _mm_madd_epi16(s3, c3));
                e2 = _mm_add_epi32(e0, e1);

                v0 = _mm_add_epi32(v0, e2);

                pb8 += 32;
                coeff += (4 * line);
            }
            r0 = _mm_add_epi32(v0, rnd_factor);
            r1 = _mm_packs_epi32(_mm_srai_epi32(r0, shift), zero);
            _mm_storel_epi64((__m128i*)block, r1);
            coeff -= (8 * line);
            pb8 -= 60;
            block += 4;
        }
        coeff++;
    }
}